

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O2

void __thiscall Rml::BaseXMLParser::ReadHeader(BaseXMLParser *this)

{
  bool bVar1;
  String temp;
  
  bVar1 = PeekString(this,"<?",true);
  if (bVar1) {
    temp._M_dataplus._M_p = (pointer)&temp.field_2;
    temp._M_string_length = 0;
    temp.field_2._M_local_buf[0] = '\0';
    FindString(this,">",&temp,false);
    ::std::__cxx11::string::~string((string *)&temp);
  }
  return;
}

Assistant:

void BaseXMLParser::ReadHeader()
{
	if (PeekString("<?"))
	{
		String temp;
		FindString(">", temp);
	}
}